

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void QtPrivate::QDebugStreamOperatorForType<QList<QString>,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  QList<QString> local_20;
  
  local_20.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)dbg->stream;
  ((Stream *)local_20.d.d)->ref = ((Stream *)local_20.d.d)->ref + 1;
  ::operator<<((QDebug)&local_20.d.ptr,&local_20);
  QDebug::~QDebug((QDebug *)&local_20.d.ptr);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20.d.size) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }